

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateCleanOldSingles(Fxu_Matrix *p)

{
  int iVar1;
  Fxu_Single *local_38;
  Fxu_Single *local_30;
  int Counter;
  int WeightNew;
  Fxu_Single *pSingle2;
  Fxu_Single *pSingle;
  Fxu_Matrix *p_local;
  
  pSingle2 = (p->lSingles).pHead;
  if (pSingle2 == (Fxu_Single *)0x0) {
    local_30 = (Fxu_Single *)0x0;
  }
  else {
    local_30 = pSingle2->pNext;
  }
  _Counter = local_30;
  while (pSingle2 != (Fxu_Single *)0x0) {
    if ((pSingle2->pVar1->pOrder != (Fxu_Var *)0x0) || (pSingle2->pVar2->pOrder != (Fxu_Var *)0x0))
    {
      iVar1 = Fxu_SingleCountCoincidence(p,pSingle2->pVar1,pSingle2->pVar2);
      if (iVar1 + -2 < 0) {
        Fxu_HeapSingleDelete(p->pHeapSingle,pSingle2);
        Fxu_ListMatrixDelSingle(p,pSingle2);
        if (pSingle2 != (Fxu_Single *)0x0) {
          Fxu_MemRecycle(p,(char *)pSingle2,0x30);
        }
      }
      else {
        pSingle2->Weight = iVar1 + -2;
        Fxu_HeapSingleUpdate(p->pHeapSingle,pSingle2);
      }
    }
    pSingle2 = _Counter;
    if (_Counter == (Fxu_Single *)0x0) {
      local_38 = (Fxu_Single *)0x0;
    }
    else {
      local_38 = _Counter->pNext;
    }
    _Counter = local_38;
  }
  return;
}

Assistant:

void Fxu_UpdateCleanOldSingles( Fxu_Matrix * p )
{ 
    Fxu_Single * pSingle, * pSingle2;
    int WeightNew;
    int Counter = 0;

    Fxu_MatrixForEachSingleSafe( p, pSingle, pSingle2 )
    {
        // if at least one of the variables is marked, recalculate
        if ( pSingle->pVar1->pOrder || pSingle->pVar2->pOrder )
        {
            Counter++;
            // get the new weight
            WeightNew = -2 + Fxu_SingleCountCoincidence( p, pSingle->pVar1, pSingle->pVar2 );
            if ( WeightNew >= 0 )
            {
                pSingle->Weight = WeightNew;
                Fxu_HeapSingleUpdate( p->pHeapSingle, pSingle );
            }
            else
            {
                Fxu_HeapSingleDelete( p->pHeapSingle, pSingle );
                Fxu_ListMatrixDelSingle( p, pSingle );
		        MEM_FREE_FXU( p, Fxu_Single, 1, pSingle );
            }
        }
    }
//    printf( "Called procedure %d times.\n", Counter );
}